

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall CBlockPolicyEstimator::FlushFeeEstimates(CBlockPolicyEstimator *this)

{
  path *this_00;
  bool bVar1;
  FILE *pFVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_a8;
  AutoFile local_88;
  path local_68;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_estimation_filepath;
  pFVar2 = fsbridge::fopen((char *)this_00,"wb");
  local_88.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_file = (FILE *)pFVar2;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_a8);
  if (pFVar2 != (FILE *)0x0) {
    bVar1 = Write(this,&local_88);
    if (bVar1) {
      fs::path::filename((path *)&local_68,this_00);
      std::filesystem::__cxx11::path::string(&local_40,&local_68);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      logging_function._M_str = "FlushFeeEstimates";
      logging_function._M_len = 0x11;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x3bc,ALL,Info,"Flushed fee estimates to %s.\n",
                 &local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::filesystem::__cxx11::path::~path(&local_68);
      goto LAB_007c50af;
    }
  }
  std::filesystem::__cxx11::path::string(&local_68._M_pathname,&this_00->super_path);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp";
  source_file_00._M_len = 0x58;
  logging_function_00._M_str = "FlushFeeEstimates";
  logging_function_00._M_len = 0x11;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function_00,source_file_00,0x3ba,ALL,Info,
             "Failed to write fee estimates to %s. Continue anyway.\n",&local_68._M_pathname);
  std::__cxx11::string::~string((string *)&local_68);
LAB_007c50af:
  AutoFile::~AutoFile(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::FlushFeeEstimates()
{
    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "wb")};
    if (est_file.IsNull() || !Write(est_file)) {
        LogPrintf("Failed to write fee estimates to %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    } else {
        LogPrintf("Flushed fee estimates to %s.\n", fs::PathToString(m_estimation_filepath.filename()));
    }
}